

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADEC-CORE.cpp
# Opt level: O0

void build_non_adjacent_table
               (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *edges)

{
  int iVar1;
  bool bVar2;
  void *__s;
  ulong uVar3;
  pair<int,_int> local_48;
  int local_40;
  int local_3c;
  int j;
  int i;
  pair<int,_int> *e;
  iterator __end1;
  iterator __begin1;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *__range1;
  bool *graph;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *edges_local;
  
  uVar3 = (ulong)(size * size);
  if ((long)uVar3 < 0) {
    uVar3 = 0xffffffffffffffff;
  }
  __s = operator_new__(uVar3);
  memset(__s,0,(long)size * (long)size);
  __end1 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin(edges);
  e = (pair<int,_int> *)
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end(edges);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                                     *)&e), bVar2) {
    _j = __gnu_cxx::
         __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
         ::operator*(&__end1);
    *(undefined1 *)((long)__s + (long)(_j->first * size + _j->second)) = 1;
    *(undefined1 *)((long)__s + (long)(_j->second * size + _j->first)) = 1;
    __gnu_cxx::
    __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
    ::operator++(&__end1);
  }
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::clear(edges);
  for (local_3c = 0; iVar1 = local_3c, local_3c < size; local_3c = local_3c + 1) {
    while (local_40 = iVar1 + 1, local_40 < size) {
      iVar1 = local_40;
      if ((*(byte *)((long)__s + (long)(local_3c * size + local_40)) & 1) == 0) {
        local_48 = std::make_pair<int&,int&>(&local_3c,&local_40);
        std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
                  (edges,&local_48);
        iVar1 = local_40;
      }
    }
  }
  if (__s != (void *)0x0) {
    operator_delete__(__s);
  }
  build_adjacent_table(edges,&NAdjB,NAdjP);
  return;
}

Assistant:

void build_non_adjacent_table(vector<pair<int, int> > edges) {
    bool *graph = new bool[size * size];
    memset(graph, 0, sizeof(bool) * size * size);
    for (auto &e: edges) {
        graph[e.first * size + e.second] = true;
        graph[e.second * size + e.first] = true;
    }
    edges.clear();
    for (int i = 0; i < size; ++i) 
        for (int j = i+1; j < size; ++j) if (!graph[i * size + j]) {
            edges.push_back(make_pair(i, j));
        }
    delete[] graph;
    build_adjacent_table(edges, &NAdjB, NAdjP);
}